

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilizationWidget.cpp
# Opt level: O3

void __thiscall
UtilizationWidget::UtilizationWidget(UtilizationWidget *this,UtilizationContainer *container)

{
  int iVar1;
  undefined4 *puVar2;
  long lVar3;
  long lVar4;
  QObject local_50 [8];
  QSlotObjectBase local_48;
  code *local_38;
  undefined8 local_30;
  
  QWidget::QWidget(&this->super_QWidget,0,0);
  *(undefined ***)this = &PTR_metaObject_0012c330;
  *(undefined ***)&this->field_0x10 = &PTR__UtilizationWidget_0012c4e8;
  (this->utilizationData).s = 0;
  (this->utilizationData).ptr = (UtilizationData *)(this->utilizationData).array;
  (this->utilizationData).a = 0x100;
  (this->graphPoints).s = 0;
  (this->graphPoints).ptr =
       (vector<Point<float>,_std::allocator<Point<float>_>_> *)(this->graphPoints).array;
  (this->graphPoints).a = 0x100;
  QPainter::QPainter(&this->painter);
  this->lastTime = 0;
  iVar1 = InfoProvider::getGPUCount();
  lVar4 = (long)iVar1;
  lVar3 = (this->graphPoints).a;
  if (lVar3 <= lVar4) {
    lVar3 = lVar4;
  }
  QVarLengthArray<std::vector<Point<float>,_std::allocator<Point<float>_>_>,_256LL>::reallocate
            (&this->graphPoints,lVar4,lVar3);
  iVar1 = InfoProvider::getGPUCount();
  lVar4 = (long)iVar1;
  lVar3 = (this->utilizationData).a;
  if (lVar3 <= lVar4) {
    lVar3 = lVar4;
  }
  QVarLengthArray<UtilizationData,_256LL>::reallocate(&this->utilizationData,lVar4,lVar3);
  QWidget::setSizePolicy((QSizePolicy)SUB84(this,0));
  QWidget::setMinimumHeight((int)SUB84(this,0));
  local_38 = UtilizationContainer::onDataUpdated;
  local_30 = 0;
  local_48.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x1a1;
  local_48._4_4_ = 0;
  local_48.m_impl = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<void_(UtilizationWidget::*)(),_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar2 + 4) = 0x1a1;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)container,(QObject *)&local_38,(void **)this,&local_48,
             (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  return;
}

Assistant:

UtilizationWidget::UtilizationWidget(UtilizationContainer *container) {
    graphPoints.resize(InfoProvider::getGPUCount());
    utilizationData.resize(InfoProvider::getGPUCount());

    setSizePolicy(QSizePolicy::Expanding, QSizePolicy::Expanding);
    setMinimumHeight(96);

    connect(container, &UtilizationContainer::onDataUpdated, this, &UtilizationWidget::onDataUpdated);
}